

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_udp.c
# Opt level: O2

int mm_close_udp(void)

{
  close(sock);
  return 0;
}

Assistant:

int mm_close_udp(void) {
    /* close UDP socket */
#ifdef _WIN32
    closesocket(sock);
    WSACleanup();
#else
    close(sock);
#endif /* _WIN32 */

    return 0;
}